

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::TryFastAppend
          (SnappyIOVecWriter *this,char *ip,size_t available,size_t len,char **param_4)

{
  char *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  
  bVar3 = false;
  if (((0x14 < available) && (len < 0x11)) && (0xf < this->output_limit_ - this->total_written_)) {
    if (this->curr_iov_remaining_ < 0x10) {
      return false;
    }
    pcVar1 = this->curr_iov_output_;
    uVar2 = *(undefined8 *)(ip + 8);
    *(undefined8 *)pcVar1 = *(undefined8 *)ip;
    *(undefined8 *)(pcVar1 + 8) = uVar2;
    this->curr_iov_output_ = this->curr_iov_output_ + len;
    this->curr_iov_remaining_ = this->curr_iov_remaining_ - len;
    this->total_written_ = this->total_written_ + len;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

inline bool TryFastAppend(const char* ip, size_t available, size_t len,
                            char**) {
    const size_t space_left = output_limit_ - total_written_;
    if (len <= 16 && available >= 16 + kMaximumTagLength && space_left >= 16 &&
        curr_iov_remaining_ >= 16) {
      // Fast path, used for the majority (about 95%) of invocations.
      UnalignedCopy128(ip, curr_iov_output_);
      curr_iov_output_ += len;
      curr_iov_remaining_ -= len;
      total_written_ += len;
      return true;
    }

    return false;
  }